

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.h
# Opt level: O0

int __thiscall CTcTokString::copy(CTcTokString *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  char *pcVar1;
  
  (*this->_vptr_CTcTokString[2])(this,src);
  memcpy(this->buf_,dst,(size_t)src);
  this->buf_len_ = (size_t)src;
  pcVar1 = this->buf_;
  pcVar1[this->buf_len_] = '\0';
  return (int)pcVar1;
}

Assistant:

virtual void copy(const char *p, size_t len)
    {
        /* ensure we have enough space */
        ensure_space(len);

        /* copy the text */
        memcpy(buf_, p, len);

        /* set our length */
        buf_len_ = len;

        /* null-terminate it */
        buf_[buf_len_] = '\0';
    }